

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

_Bool ray_intersect_aabb(vec3 ro,vec3 rd,vec3 aabb_min,vec3 aabb_max,float *t)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar6 = (aabb_min.x - ro.x) / rd.x;
  fVar7 = (aabb_max.x - ro.x) / rd.x;
  fVar3 = fVar7;
  if (fVar6 <= fVar7) {
    fVar3 = fVar6;
  }
  fVar4 = (aabb_min.y - ro.y) / rd.y;
  fVar5 = (aabb_max.y - ro.y) / rd.y;
  fVar2 = fVar4;
  if (fVar4 <= fVar5) {
    fVar2 = fVar5;
  }
  _Var1 = false;
  if (fVar3 <= fVar2) {
    if (fVar6 <= fVar7) {
      fVar6 = fVar7;
    }
    if (fVar4 <= fVar5) {
      fVar5 = fVar4;
    }
    if (fVar5 <= fVar6) {
      if (fVar5 <= fVar3) {
        fVar5 = fVar3;
      }
      fVar4 = (aabb_min.z - ro.z) / rd.z;
      fVar7 = (aabb_max.z - ro.z) / rd.z;
      fVar3 = fVar4;
      if (fVar4 <= fVar7) {
        fVar3 = fVar7;
      }
      _Var1 = false;
      if (fVar5 <= fVar3) {
        if (fVar6 <= fVar2) {
          fVar2 = fVar6;
        }
        if (fVar4 <= fVar7) {
          fVar7 = fVar4;
        }
        if (fVar7 <= fVar2) {
          if (fVar7 <= fVar5) {
            fVar7 = fVar5;
          }
          *t = fVar7;
          _Var1 = true;
        }
      }
    }
  }
  return _Var1;
}

Assistant:

bool ray_intersect_aabb(vec3 ro, vec3 rd, vec3 aabb_min, vec3 aabb_max, float *t) {
    vec3 min = aabb_min;
    vec3 max = aabb_max;

    float tmin = (min.x - ro.x) / rd.x;
    float tmax = (max.x - ro.x) / rd.x;

    if (tmin > tmax) {
        float temp = tmin;
        tmin = tmax;
        tmax = temp;
    }

    float tymin = (min.y - ro.y) / rd.y;
    float tymax = (max.y - ro.y) / rd.y;

    if (tymin > tymax) {
        float temp = tymin;
        tymin = tymax;
        tymax = temp;
    }

    if ((tmin > tymax) || (tymin > tmax))
        return false;

    if (tymin > tmin)
        tmin = tymin;

    if (tymax < tmax)
        tmax = tymax;

    float tzmin = (min.z - ro.z) / rd.z;
    float tzmax = (max.z - ro.z) / rd.z;

    if (tzmin > tzmax) {
        float temp = tzmin;
        tzmin = tzmax;
        tzmax = temp;
    }

    if ((tmin > tzmax) || (tzmin > tmax))
        return false;

    if (tzmin > tmin)
        tmin = tzmin;

    if (tzmax < tmax)
        tmax = tzmax;

    *t = tmin;

    return true;
}